

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O0

string * cpp_client::Game_registry::get_version(string *name)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  Game_not_found *this;
  char local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  key_type *local_10;
  string *name_local;
  
  local_10 = name;
  puVar1 = version_map_abi_cxx11_();
  sVar2 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(puVar1,local_10);
  if (sVar2 != 0) {
    puVar1 = version_map_abi_cxx11_();
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](puVar1,local_10);
    return pmVar3;
  }
  this = (Game_not_found *)__cxa_allocate_exception(0x10);
  std::operator+(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "The requested game \"");
  std::operator+(local_30,local_50);
  Game_not_found::range_error(this,local_30);
  __cxa_throw(this,&Game_not_found::typeinfo,Game_not_found::~Game_not_found);
}

Assistant:

std::string& Game_registry::get_version(const std::string& name)
{
   if(version_map().count(name))
   {
      return version_map()[name];
   }
   else
   {
      throw Game_not_found("The requested game \"" + name + "\" was not found.");
   }
}